

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

int __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>>
::AddConstraint<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
           *this,int d,
          ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *args)

{
  size_type sVar1;
  int *in_RDX;
  undefined4 in_ESI;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *in_RDI;
  Container *in_stack_00000230;
  int in_stack_0000023c;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
  *in_stack_00000240;
  undefined4 in_stack_fffffffffffffff0;
  
  std::
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>>::Container,std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>>::Container>>
  ::
  emplace_back<int&,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
            ((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container>_>
              *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RDI);
  std::
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>::Container>_>
  ::size((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container>_>
          *)0x23d913);
  std::
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>::Container>_>
  ::back((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container>_>
          *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>
  ::ExportConstraint(in_stack_00000240,in_stack_0000023c,in_stack_00000230);
  sVar1 = std::
          deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>::Container>_>
          ::size((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container>_>
                  *)0x23d94e);
  return (int)sVar1 + -1;
}

Assistant:

int AddConstraint(int d, Args&&... args)
  {
    cons_.emplace_back( d, std::move(args)... );
    ExportConstraint(cons_.size()-1, cons_.back());
    // fmt::MemoryWriter wrt;
    // WriteCon2JSON(wrt, cons_.size()-1, cons_.back());
    // printf("%s\n", wrt.c_str());
    return cons_.size()-1;
  }